

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O1

void __thiscall mjs::global_object_impl::fixup(global_object_impl *this)

{
  gc_heap *this_00;
  long lVar1;
  
  this_00 = (this->super_global_object).super_object.heap_;
  if ((this->string_cache_).entries_.pos_ != 0) {
    gc_heap::register_fixup(this_00,(uint32_t *)&this->string_cache_);
  }
  if ((this->object_prototype_).pos_ != 0) {
    gc_heap::register_fixup(this_00,&(this->object_prototype_).pos_);
  }
  if ((this->function_prototype_).pos_ != 0) {
    gc_heap::register_fixup(this_00,&(this->function_prototype_).pos_);
  }
  if ((this->array_prototype_).pos_ != 0) {
    gc_heap::register_fixup(this_00,&(this->array_prototype_).pos_);
  }
  if ((this->string_prototype_).pos_ != 0) {
    gc_heap::register_fixup(this_00,&(this->string_prototype_).pos_);
  }
  if ((this->boolean_prototype_).pos_ != 0) {
    gc_heap::register_fixup(this_00,&(this->boolean_prototype_).pos_);
  }
  if ((this->number_prototype_).pos_ != 0) {
    gc_heap::register_fixup(this_00,&(this->number_prototype_).pos_);
  }
  if ((this->regexp_prototype_).pos_ != 0) {
    gc_heap::register_fixup(this_00,&(this->regexp_prototype_).pos_);
  }
  lVar1 = 0x90;
  do {
    if (*(int *)((long)&(this->super_global_object).super_object._vptr_object + lVar1) != 0) {
      gc_heap::register_fixup
                (this_00,(uint32_t *)
                         ((long)&(this->super_global_object).super_object._vptr_object + lVar1));
    }
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xb0);
  if ((this->thrower_).pos_ != 0) {
    gc_heap::register_fixup(this_00,&(this->thrower_).pos_);
  }
  object::fixup((object *)this);
  return;
}

Assistant:

void fixup() {
        auto& h = heap();
        string_cache_.fixup(h);
        object_prototype_.fixup(h);
        function_prototype_.fixup(h);
        array_prototype_.fixup(h);
        string_prototype_.fixup(h);
        boolean_prototype_.fixup(h);
        number_prototype_.fixup(h);
        regexp_prototype_.fixup(h);
        for (auto& e: error_prototype_) {
            e.fixup(h);
        }
        thrower_.fixup(h);
        global_object::fixup();
    }